

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

void __thiscall google::protobuf::MapValueRef::SetFloatValue(MapValueRef *this,float value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessage local_60;
  float local_28;
  LogFinisher local_21;
  
  local_28 = value;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_FLOAT) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map_field.h"
               ,0x269);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::SetFloatValue");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)0x346504);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8));
    internal::LogFinisher::operator=(&local_21,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  *(float *)this->data_ = local_28;
  return;
}

Assistant:

void SetFloatValue(float value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_FLOAT, "MapValueRef::SetFloatValue");
    *reinterpret_cast<float*>(data_) = value;
  }